

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_tests.cpp
# Opt level: O1

void __thiscall system_tests::run_command::test_method(run_command *this)

{
  UniValue *pUVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  string_view key;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  string_view key_00;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  string expected_1;
  string command;
  UniValue result;
  check_type cVar5;
  char *pcVar4;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  readonly_property<bool> *local_520 [7];
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 local_2b8 [16];
  char *local_2a8;
  char *local_2a0;
  readonly_property<bool> local_290 [16];
  undefined1 *local_280 [2];
  UniValue local_270;
  UniValue local_218;
  assertion_result local_1c0;
  UniValue local_1a0;
  UniValue local_148;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [8];
  bool local_c8;
  undefined7 uStack_c7;
  undefined1 local_c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<UniValue,_std::allocator<UniValue>_> local_90;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  undefined1 local_58 [16];
  undefined1 auStack_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = auStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  RunCommandParseJSON((UniValue *)local_d0,(string *)local_58,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,aStack_68._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58._0_8_ != auStack_48) {
    operator_delete((void *)local_58._0_8_,auStack_48._0_8_ + 1);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x19;
  file.m_begin = (iterator)&local_2f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_308,msg);
  local_78[0] = (class_property<bool>)(class_property<bool>)(local_d0._0_4_ == VNULL);
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_f0._0_8_ = "result.isNull()";
  local_f0._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_310 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar5,
             (size_t)&local_318,0x19);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_c7,local_c8) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_c7,local_c8),local_b8._M_allocated_capacity + 1);
  }
  local_58._0_8_ = auStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"echo {\"success\": true}","");
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  RunCommandParseJSON((UniValue *)local_d0,(string *)local_58,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,aStack_68._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58._0_8_ != auStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(auStack_48._0_8_ + 1));
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1d;
  file_00.m_begin = (iterator)&local_328;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_338,
             msg_00);
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_f0._0_8_ = "result.isObject()";
  local_f0._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_340 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = local_f0;
  local_78[0] = (class_property<bool>)(class_property<bool>)(local_d0._0_4_ == VOBJ);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar5,
             (size_t)&local_348,0x1d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  key._M_str = "success";
  key._M_len = 7;
  pUVar1 = ::UniValue::find_value((UniValue *)local_d0,key);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_358;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_368,
             msg_01);
  local_78[0] = (class_property<bool>)(class_property<bool>)(pUVar1->typ != VNULL);
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_f0._0_8_ = "!success.isNull()";
  local_f0._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_370 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar5,
             (size_t)&local_378,0x1f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x20;
  file_02.m_begin = (iterator)&local_388;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_398,
             msg_02);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290[0].super_class_property<bool>.value = (class_property<bool>)::UniValue::get_bool(pUVar1)
  ;
  local_520[0] = local_290;
  local_280[0] = local_2b8;
  local_2b8[0] = 1;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)local_290[0].super_class_property<bool>.value;
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_2a0 = "";
  auStack_48._8_8_ = local_520;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = local_280;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar4 = "success.get_bool()";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)local_f0,1,2,REQUIRE,0xf40381,(size_t)&local_2a8,0x20,
             (lazy_ostream *)local_58,"true",(assertion_result *)local_78);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_c7,local_c8) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_c7,local_c8),local_b8._M_allocated_capacity + 1);
  }
  local_d0 = (undefined1  [8])local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"execve failed: ","");
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x25;
  file_03.m_begin = (iterator)&local_3a8;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3b8,
             msg_03);
  local_58._0_8_ = auStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"invalid_command","");
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  RunCommandParseJSON(&local_148,(string *)local_58,(string *)local_78);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_148.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.val._M_dataplus._M_p != &local_148.val.field_2) {
    operator_delete(local_148.val._M_dataplus._M_p,local_148.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,(ulong)(aStack_68._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_58._0_8_ != auStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(auStack_48._0_8_ + 1));
  }
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x25;
  file_04.m_begin = (iterator)&local_3c8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d8,
             msg_04);
  local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013aef90;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = "exception subprocess::CalledProcessError expected but not raised";
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_3e0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)pcVar4,
             (size_t)&local_3e8,0x25);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  if (local_d0 != (undefined1  [8])local_c0) {
    operator_delete((void *)local_d0,(long)local_c0 + 1);
  }
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"false","");
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2e;
  file_05.m_begin = (iterator)&local_428;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_438,
             msg_05);
  local_d0 = (undefined1  [8])local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  RunCommandParseJSON(&local_1a0,(string *)local_f0,(string *)local_d0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.val._M_dataplus._M_p != &local_1a0.val.field_2) {
    operator_delete(local_1a0.val._M_dataplus._M_p,local_1a0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != (undefined1  [8])local_c0) {
    operator_delete((void *)local_d0,(long)local_c0 + 1);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x2e;
  file_06.m_begin = (iterator)&local_448;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_458,
             msg_06);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  auStack_48._0_8_ = 0;
  local_c8 = false;
  local_d0 = (undefined1  [8])&PTR__lazy_ostream_013ac470;
  local_c0 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_b8._M_allocated_capacity = 0xe581c2;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_460 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_d0,1,1,WARN,(check_type)pcVar4,
             (size_t)&local_468,0x2e);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._M_allocated_capacity + 1));
  }
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"sh -c \'echo err 1>&2 && false\'","");
  local_1c0._0_8_ = &local_1c0.m_message.pn;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"err","");
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x39;
  file_07.m_begin = (iterator)&local_4a8;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4b8,
             msg_07);
  local_d0 = (undefined1  [8])local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
  RunCommandParseJSON(&local_218,(string *)local_f0,(string *)local_d0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_218.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.val._M_dataplus._M_p != &local_218.val.field_2) {
    operator_delete(local_218.val._M_dataplus._M_p,local_218.val.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != (undefined1  [8])local_c0) {
    operator_delete((void *)local_d0,(ulong)((long)local_c0 + 1));
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x39;
  file_08.m_begin = (iterator)&local_4c8;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4d8,
             msg_08);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  auStack_48._0_8_ = 0;
  local_c8 = false;
  local_d0 = (undefined1  [8])&PTR__lazy_ostream_013ac470;
  local_c0 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_b8._M_allocated_capacity = 0xe581c2;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_4e0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_d0,1,1,WARN,(check_type)pcVar4,
             (size_t)&local_4e8,0x39);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_48);
  if ((shared_count *)local_1c0._0_8_ != &local_1c0.m_message.pn) {
    operator_delete((void *)local_1c0._0_8_,
                    (ulong)((long)&(local_1c0.m_message.pn.pi_)->_vptr_sp_counted_base + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._M_allocated_capacity + 1));
  }
  local_d0 = (undefined1  [8])local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"echo {","");
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x3e;
  file_09.m_begin = (iterator)&local_540;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_550,
             msg_09);
  local_58._0_8_ = auStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  RunCommandParseJSON(&local_270,(string *)local_d0,(string *)local_58);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != &local_270.val.field_2) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58._0_8_ != auStack_48) {
    operator_delete((void *)local_58._0_8_,auStack_48._0_8_ + 1);
  }
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x3e;
  file_10.m_begin = (iterator)&local_560;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_570,
             msg_10);
  local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ac470;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = "exception std::runtime_error expected but not raised";
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_578 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,1,WARN,(check_type)pcVar4,
             (size_t)&local_580,0x3e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  if (local_d0 != (undefined1  [8])local_c0) {
    operator_delete((void *)local_d0,(ulong)((long)local_c0 + 1));
  }
  local_58._0_8_ = auStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"cat","");
  local_78._0_8_ = &aStack_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"{\"success\": true}","");
  RunCommandParseJSON((UniValue *)local_d0,(string *)local_58,(string *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &aStack_68) {
    operator_delete((void *)local_78._0_8_,aStack_68._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58._0_8_ != auStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(auStack_48._0_8_ + 1));
  }
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x43;
  file_11.m_begin = (iterator)&local_5c0;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5d0,
             msg_11);
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_f0._0_8_ = "result.isObject()";
  local_f0._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_5d8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = (string *)local_f0;
  local_78[0] = (class_property<bool>)(class_property<bool>)(local_d0._0_4_ == VOBJ);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar4,
             (size_t)&local_5e0,0x43);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  key_00._M_str = "success";
  key_00._M_len = 7;
  pUVar1 = ::UniValue::find_value((UniValue *)local_d0,key_00);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x45;
  file_12.m_begin = (iterator)&local_5f0;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_600,
             msg_12);
  local_78[0] = (class_property<bool>)(class_property<bool>)(pUVar1->typ != VNULL);
  local_78._8_8_ = (element_type *)0x0;
  aStack_68._M_allocated_capacity = 0;
  local_f0._0_8_ = "!success.isNull()";
  local_f0._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abc70;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_608 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  auStack_48._8_8_ = (string *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,(check_type)pcVar4,
             (size_t)&local_610,0x45);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_68._M_allocated_capacity);
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x46;
  file_13.m_begin = (iterator)&local_620;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_630,
             msg_13);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290[0].super_class_property<bool>.value = (class_property<bool>)::UniValue::get_bool(pUVar1)
  ;
  local_2b8[0] = 1;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)local_290[0].super_class_property<bool>.value;
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/system_tests.cpp"
  ;
  local_2a0 = "";
  local_520[0] = local_290;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013abe90;
  auStack_48._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_48._8_8_ = local_520;
  local_280[0] = local_2b8;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_013abe90;
  aStack_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_68._8_8_ = local_280;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)local_f0,1,2,REQUIRE,0xf40381,(size_t)&local_2a8,0x46,
             (lazy_ostream *)local_58,"true",(assertion_result *)local_78);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_c7,local_c8) != &local_b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_c7,local_c8),(ulong)(local_b8._M_allocated_capacity + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(run_command)
{
    {
        const UniValue result = RunCommandParseJSON("");
        BOOST_CHECK(result.isNull());
    }
    {
        const UniValue result = RunCommandParseJSON("echo {\"success\": true}");
        BOOST_CHECK(result.isObject());
        const UniValue& success = result.find_value("success");
        BOOST_CHECK(!success.isNull());
        BOOST_CHECK_EQUAL(success.get_bool(), true);
    }
    {
        // An invalid command is handled by cpp-subprocess
        const std::string expected{"execve failed: "};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON("invalid_command"), subprocess::CalledProcessError, HasReason(expected));
    }
    {
        // Return non-zero exit code, no output to stderr
        const std::string command{"false"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, [&](const std::runtime_error& e) {
            const std::string what{e.what()};
            BOOST_CHECK(what.find(strprintf("RunCommandParseJSON error: process(%s) returned 1: \n", command)) != std::string::npos);
            return true;
        });
    }
    {
        // Return non-zero exit code, with error message for stderr
        const std::string command{"sh -c 'echo err 1>&2 && false'"};
        const std::string expected{"err"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, [&](const std::runtime_error& e) {
            const std::string what(e.what());
            BOOST_CHECK(what.find(strprintf("RunCommandParseJSON error: process(%s) returned", command)) != std::string::npos);
            BOOST_CHECK(what.find(expected) != std::string::npos);
            return true;
        });
    }
    {
        // Unable to parse JSON
        const std::string command{"echo {"};
        BOOST_CHECK_EXCEPTION(RunCommandParseJSON(command), std::runtime_error, HasReason("Unable to parse JSON: {"));
    }
    // Test std::in
    {
        const UniValue result = RunCommandParseJSON("cat", "{\"success\": true}");
        BOOST_CHECK(result.isObject());
        const UniValue& success = result.find_value("success");
        BOOST_CHECK(!success.isNull());
        BOOST_CHECK_EQUAL(success.get_bool(), true);
    }
}